

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlAddDefAttrs(xmlParserCtxtPtr ctxt,xmlChar *fullname,xmlChar *fullattr,xmlChar *value)

{
  int iVar1;
  xmlEntityPtr pxVar2;
  bool bVar3;
  uint uVar4;
  void *pvVar5;
  xmlHashTablePtr pxVar6;
  xmlChar *pxVar7;
  int *payload;
  size_t sVar8;
  uint uVar9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  int iVar12;
  ulong uVar13;
  xmlHashedString xVar14;
  int len;
  int local_4c;
  xmlChar *local_48;
  int *local_40;
  xmlChar *local_38;
  
  if ((ctxt->attsSpecial != (xmlHashTablePtr)0x0) &&
     (pvVar5 = xmlHashLookup2(ctxt->attsSpecial,fullname,fullattr), pvVar5 != (void *)0x0)) {
    return;
  }
  if (ctxt->attsDefault == (xmlHashTablePtr)0x0) {
    pxVar6 = xmlHashCreateDict(10,ctxt->dict);
    ctxt->attsDefault = pxVar6;
    if (pxVar6 == (xmlHashTablePtr)0x0) goto LAB_001367bb;
  }
  pxVar7 = xmlSplitQName3(fullname,&local_4c);
  if (pxVar7 == (xmlChar *)0x0) {
    xVar14 = xmlDictLookupHashed(ctxt->dict,fullname,-1);
    pxVar7 = xVar14.name;
    if (pxVar7 == (xmlChar *)0x0) goto LAB_001367bb;
    pxVar10 = (xmlChar *)0x0;
  }
  else {
    xVar14 = xmlDictLookupHashed(ctxt->dict,pxVar7,-1);
    pxVar7 = xVar14.name;
    xVar14 = xmlDictLookupHashed(ctxt->dict,fullname,local_4c);
    pxVar10 = xVar14.name;
    fullname = (xmlChar *)(ulong)xVar14.hashValue;
    if (pxVar7 == (xmlChar *)0x0 || pxVar10 == (xmlChar *)0x0) goto LAB_001367bb;
  }
  local_40 = (int *)xmlHashLookup2(ctxt->attsDefault,pxVar7,pxVar10);
  uVar4 = (uint)fullname;
  if (local_40 == (int *)0x0) {
    uVar13 = 4;
LAB_001365ed:
    local_48 = value;
    local_38 = fullattr;
    payload = (int *)(*xmlRealloc)(local_40,uVar13 << 6 | 8);
    if (payload == (int *)0x0) {
      bVar3 = false;
      value = local_48;
      fullattr = local_38;
    }
    else {
      if (local_40 == (int *)0x0) {
        *payload = 0;
      }
      payload[1] = (int)uVar13;
      iVar12 = xmlHashUpdateEntry2(ctxt->attsDefault,pxVar7,pxVar10,payload,(xmlHashDeallocator)0x0)
      ;
      fullattr = local_38;
      if (iVar12 < 0) {
        (*xmlFree)(payload);
      }
      bVar3 = iVar12 >= 0;
      value = local_48;
      local_40 = payload;
    }
LAB_00136679:
    if (!bVar3) goto LAB_001367bb;
  }
  else {
    uVar9 = local_40[1];
    if ((int)uVar9 <= *local_40) {
      if (uVar9 < 100000000) {
        uVar13 = 100000000;
        if ((int)uVar9 < 0x2faf081) {
          uVar13 = (ulong)(uVar9 * 2);
        }
        goto LAB_001365ed;
      }
      bVar3 = false;
      goto LAB_00136679;
    }
  }
  pxVar7 = xmlSplitQName3(fullattr,&local_4c);
  if (pxVar7 == (xmlChar *)0x0) {
    xVar14 = xmlDictLookupHashed(ctxt->dict,fullattr,-1);
    pxVar7 = xVar14.name;
    local_48 = (xmlChar *)CONCAT44(local_48._4_4_,xVar14.hashValue);
    if (pxVar7 == (xmlChar *)0x0) goto LAB_001367bb;
    pxVar10 = (xmlChar *)0x0;
  }
  else {
    xVar14 = xmlDictLookupHashed(ctxt->dict,pxVar7,-1);
    pxVar7 = xVar14.name;
    local_48 = (xmlChar *)CONCAT44(local_48._4_4_,xVar14.hashValue);
    xVar14 = xmlDictLookupHashed(ctxt->dict,fullattr,local_4c);
    pxVar10 = xVar14.name;
    uVar4 = xVar14.hashValue;
    if (pxVar7 == (xmlChar *)0x0 || pxVar10 == (xmlChar *)0x0) goto LAB_001367bb;
  }
  sVar8 = strlen((char *)value);
  local_4c = (int)sVar8;
  xVar14 = xmlDictLookupHashed(ctxt->dict,value,local_4c);
  pxVar11 = xVar14.name;
  if (pxVar11 != (xmlChar *)0x0) {
    sVar8 = strlen((char *)pxVar7);
    iVar12 = (int)sVar8;
    if (pxVar10 != (xmlChar *)0x0) {
      sVar8 = strlen((char *)pxVar10);
      iVar12 = iVar12 + (int)sVar8;
    }
    iVar1 = *local_40;
    uVar9 = 1;
    *local_40 = iVar1 + 1;
    local_40[(long)iVar1 * 0x10 + 6] = (int)local_48;
    *(xmlChar **)(local_40 + (long)iVar1 * 0x10 + 8) = pxVar7;
    local_40[(long)iVar1 * 0x10 + 2] = uVar4;
    *(xmlChar **)(local_40 + (long)iVar1 * 0x10 + 4) = pxVar10;
    local_40[(long)iVar1 * 0x10 + 10] = xVar14.hashValue;
    *(xmlChar **)(local_40 + (long)iVar1 * 0x10 + 0xc) = pxVar11;
    *(xmlChar **)(local_40 + (long)iVar1 * 0x10 + 0xe) = pxVar11 + local_4c;
    if (ctxt->inSubset != 2) {
      pxVar2 = ctxt->input->entity;
      uVar9 = 0;
      if (pxVar2 != (xmlEntityPtr)0x0) {
        uVar9 = (uint)(pxVar2->etype == XML_EXTERNAL_PARAMETER_ENTITY);
      }
    }
    local_40[(long)iVar1 * 0x10 + 0x10] = uVar9;
    local_40[(long)iVar1 * 0x10 + 0x11] = iVar12 + local_4c;
    return;
  }
LAB_001367bb:
  xmlCtxtErrMemory(ctxt);
  return;
}

Assistant:

static void
xmlAddDefAttrs(xmlParserCtxtPtr ctxt,
               const xmlChar *fullname,
               const xmlChar *fullattr,
               const xmlChar *value) {
    xmlDefAttrsPtr defaults;
    xmlDefAttr *attr;
    int len, expandedSize;
    xmlHashedString name;
    xmlHashedString prefix;
    xmlHashedString hvalue;
    const xmlChar *localname;

    /*
     * Allows to detect attribute redefinitions
     */
    if (ctxt->attsSpecial != NULL) {
        if (xmlHashLookup2(ctxt->attsSpecial, fullname, fullattr) != NULL)
	    return;
    }

    if (ctxt->attsDefault == NULL) {
        ctxt->attsDefault = xmlHashCreateDict(10, ctxt->dict);
	if (ctxt->attsDefault == NULL)
	    goto mem_error;
    }

    /*
     * split the element name into prefix:localname , the string found
     * are within the DTD and then not associated to namespace names.
     */
    localname = xmlSplitQName3(fullname, &len);
    if (localname == NULL) {
        name = xmlDictLookupHashed(ctxt->dict, fullname, -1);
	prefix.name = NULL;
    } else {
        name = xmlDictLookupHashed(ctxt->dict, localname, -1);
	prefix = xmlDictLookupHashed(ctxt->dict, fullname, len);
        if (prefix.name == NULL)
            goto mem_error;
    }
    if (name.name == NULL)
        goto mem_error;

    /*
     * make sure there is some storage
     */
    defaults = xmlHashLookup2(ctxt->attsDefault, name.name, prefix.name);
    if ((defaults == NULL) ||
        (defaults->nbAttrs >= defaults->maxAttrs)) {
        xmlDefAttrsPtr temp;
        int newSize;

        if (defaults == NULL) {
            newSize = 4;
        } else {
            if ((defaults->maxAttrs >= XML_MAX_ATTRS) ||
                ((size_t) defaults->maxAttrs >
                     SIZE_MAX / 2 / sizeof(temp[0]) - sizeof(*defaults)))
                goto mem_error;

            if (defaults->maxAttrs > XML_MAX_ATTRS / 2)
                newSize = XML_MAX_ATTRS;
            else
                newSize = defaults->maxAttrs * 2;
        }
        temp = xmlRealloc(defaults,
                          sizeof(*defaults) + newSize * sizeof(xmlDefAttr));
	if (temp == NULL)
	    goto mem_error;
        if (defaults == NULL)
            temp->nbAttrs = 0;
	temp->maxAttrs = newSize;
        defaults = temp;
	if (xmlHashUpdateEntry2(ctxt->attsDefault, name.name, prefix.name,
	                        defaults, NULL) < 0) {
	    xmlFree(defaults);
	    goto mem_error;
	}
    }

    /*
     * Split the attribute name into prefix:localname , the string found
     * are within the DTD and hen not associated to namespace names.
     */
    localname = xmlSplitQName3(fullattr, &len);
    if (localname == NULL) {
        name = xmlDictLookupHashed(ctxt->dict, fullattr, -1);
	prefix.name = NULL;
    } else {
        name = xmlDictLookupHashed(ctxt->dict, localname, -1);
	prefix = xmlDictLookupHashed(ctxt->dict, fullattr, len);
        if (prefix.name == NULL)
            goto mem_error;
    }
    if (name.name == NULL)
        goto mem_error;

    /* intern the string and precompute the end */
    len = strlen((const char *) value);
    hvalue = xmlDictLookupHashed(ctxt->dict, value, len);
    if (hvalue.name == NULL)
        goto mem_error;

    expandedSize = strlen((const char *) name.name);
    if (prefix.name != NULL)
        expandedSize += strlen((const char *) prefix.name);
    expandedSize += len;

    attr = &defaults->attrs[defaults->nbAttrs++];
    attr->name = name;
    attr->prefix = prefix;
    attr->value = hvalue;
    attr->valueEnd = hvalue.name + len;
    attr->external = PARSER_EXTERNAL(ctxt);
    attr->expandedSize = expandedSize;

    return;

mem_error:
    xmlErrMemory(ctxt);
}